

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XInstPrinter.c
# Opt level: O3

char * M680X_reg_name(csh handle,uint reg)

{
  char (*pacVar1) [10];
  
  pacVar1 = (char (*) [10])0x0;
  if (reg < 0x16) {
    pacVar1 = s_reg_names + reg;
  }
  return *pacVar1;
}

Assistant:

const char *M680X_reg_name(csh handle, unsigned int reg)
{
#ifndef CAPSTONE_DIET

	if (reg >= ARR_SIZE(s_reg_names))
		return NULL;

	return s_reg_names[(int)reg];
#else
	return NULL;
#endif
}